

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro.c
# Opt level: O0

int coro_stack_alloc(coro_stack *stack,uint size)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t __len;
  uint in_ESI;
  long *in_RDI;
  void *base;
  size_t ssze;
  void *local_28;
  uint local_14;
  int local_4;
  
  local_14 = in_ESI;
  if (in_ESI == 0) {
    local_14 = 0x40000;
  }
  *in_RDI = 0;
  sVar2 = coro_pagesize();
  sVar3 = coro_pagesize();
  sVar4 = coro_pagesize();
  in_RDI[1] = ((((ulong)local_14 * 8 + sVar2) - 1) / sVar3) * sVar4;
  lVar1 = in_RDI[1];
  sVar2 = coro_pagesize();
  __len = lVar1 + sVar2 * 4;
  local_28 = mmap((void *)0x0,__len,7,0x22,-1,0);
  if ((local_28 == (void *)0xffffffffffffffff) &&
     (local_28 = mmap((void *)0x0,__len,3,0x22,-1,0), local_28 == (void *)0xffffffffffffffff)) {
    local_4 = 0;
  }
  else {
    sVar2 = coro_pagesize();
    mprotect(local_28,sVar2 << 2,0);
    sVar2 = coro_pagesize();
    *in_RDI = (long)((long)local_28 + sVar2 * 4);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int
coro_stack_alloc (struct coro_stack *stack, unsigned int size)
{
  if (!size)
    size = 256 * 1024;

  stack->sptr = 0;
  stack->ssze = ((size_t)size * sizeof (void *) + PAGESIZE - 1) / PAGESIZE * PAGESIZE;

#if CORO_FIBER

  stack->sptr = (void *)stack;
  return 1;

#else

  size_t ssze = stack->ssze + CORO_GUARDPAGES * PAGESIZE;
  void *base;

  #if CORO_MMAP
    /* mmap supposedly does allocate-on-write for us */
    base = mmap (0, ssze, PROT_READ | PROT_WRITE | PROT_EXEC, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);

    if (base == (void *)-1)
      {
        /* some systems don't let us have executable heap */
        /* we assume they won't need executable stack in that case */
        base = mmap (0, ssze, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);

        if (base == (void *)-1)
          return 0;
      }

    #if CORO_GUARDPAGES
      mprotect (base, CORO_GUARDPAGES * PAGESIZE, PROT_NONE);
    #endif

    base = (void*)((char *)base + CORO_GUARDPAGES * PAGESIZE);
  #else
    base = malloc (ssze);
    if (!base)
      return 0;
  #endif

  #if CORO_USE_VALGRIND
    stack->valgrind_id = VALGRIND_STACK_REGISTER ((char *)base, ((char *)base) + ssze - CORO_GUARDPAGES * PAGESIZE);
  #endif

  stack->sptr = base;
  return 1;

#endif
}